

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::unwanted_block_alert::~unwanted_block_alert(unwanted_block_alert *this)

{
  unwanted_block_alert *this_local;
  
  ~unwanted_block_alert(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT unwanted_block_alert final : peer_alert
	{
		// internal
		TORRENT_UNEXPORT unwanted_block_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep
			, peer_id const& peer_id, int block_num, piece_index_t piece_num);

		TORRENT_DEFINE_ALERT(unwanted_block_alert, 32)

		static inline constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;

		int const block_index;
		piece_index_t const piece_index;
	}